

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckOfCards.cpp
# Opt level: O0

void __thiscall DeckOfCards::DeckOfCards(DeckOfCards *this)

{
  bool bVar1;
  int iVar2;
  vector<Cards,_std::allocator<Cards>_> *pvVar3;
  ostream *this_00;
  int local_25c;
  long lStack_258;
  int j;
  ifstream file;
  allocator local_39;
  string local_38 [8];
  string fileName;
  iterator it;
  DeckOfCards *this_local;
  
  GamePieces::GamePieces(&this->super_GamePieces);
  (this->super_GamePieces)._vptr_GamePieces = (_func_int **)&PTR_shuffle_0014c970;
  __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
  __normal_iterator(&this->it);
  pvVar3 = (vector<Cards,_std::allocator<Cards>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Cards,_std::allocator<Cards>_>::vector(pvVar3);
  this->deck = pvVar3;
  pvVar3 = (vector<Cards,_std::allocator<Cards>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Cards,_std::allocator<Cards>_>::vector(pvVar3);
  this->discardedDeck = pvVar3;
  pvVar3 = (vector<Cards,_std::allocator<Cards>_> *)operator_new(0x18);
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<Cards,_std::allocator<Cards>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Cards,_std::allocator<Cards>_>::vector(pvVar3);
  this->specialDeck = pvVar3;
  __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
  __normal_iterator((__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_> *)
                    ((long)&fileName.field_2 + 8));
  std::vector<Cards,_std::allocator<Cards>_>::reserve(this->deck,8);
  std::vector<Cards,_std::allocator<Cards>_>::reserve(this->specialDeck,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"cards2.csv",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::ifstream::ifstream(&stack0xfffffffffffffda8,local_38,8);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&stack0xfffffffffffffda8 + *(long *)(lStack_258 + -0x18)));
  if (bVar1) {
    for (local_25c = 0; local_25c < 2; local_25c = local_25c + 1) {
      setCardFile(this,(ifstream *)&stack0xfffffffffffffda8,this->specialDeck);
    }
    while (iVar2 = std::istream::peek(), iVar2 != -1) {
      setCardFile(this,(ifstream *)&stack0xfffffffffffffda8,this->deck);
    }
    std::ifstream::close();
    (**(this->super_GamePieces)._vptr_GamePieces)();
    (**(this->super_GamePieces)._vptr_GamePieces)();
    std::ifstream::~ifstream(&stack0xfffffffffffffda8);
    std::__cxx11::string::~string(local_38);
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cout,"Error: Cards File failed to open ");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

DeckOfCards::DeckOfCards() {
    deck = new vector<Cards>();
    discardedDeck = new vector<Cards>();
    specialDeck = new vector<Cards>();
    vector<Cards>::iterator it;
    deck->reserve(8); // 64 regular
    specialDeck->reserve(NUMBER_OF_SPECIAL_CARDS); //2 special cards

    // cards2 has full logic implementation of 5 cards, and full details of 30 cards
    std::string  fileName= "cards2.csv";
    ifstream file(fileName);

    if(file) {
        for(int j=0; j<NUMBER_OF_SPECIAL_CARDS; j++){
            setCardFile(file,specialDeck);
        }
        while (file.peek()!=EOF)
        {
            setCardFile(file,deck);
        }
        file.close();
    }
    else{
        cout << "Error: Cards File failed to open " << endl;
        exit(1);
    }
    shuffle();
    shuffle();

}